

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedSharedMutexTest_InvalidUnlockShared1_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_InvalidUnlockShared1_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *regex;
  AssertHelper local_200;
  Message local_1f8 [6];
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  local_1b8;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_198;
  DeathTest *gtest_dt;
  AssertHelper local_170;
  Message local_168 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_f8;
  Message local_f0 [6];
  exception *e;
  undefined1 local_b0 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedSharedMutexTest_InvalidUnlockShared1_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
  *this_local;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  memset(local_b0,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_b0);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_b0);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: mtx.lock_shared() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x169,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_f0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_b0);
  if ((int)e != 0) goto LAB_0021f27e;
  memset(&e_1,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_168);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_dt,
                   "Expected: mtx.unlock_shared() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x16a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&gtest_dt);
    testing::Message::~Message(local_168);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  if ((int)e != 0) goto LAB_0021f27e;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)0x27c39e,regex);
    bVar2 = testing::internal::DeathTest::Create
                      ("mtx.unlock_shared()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x16b,&local_198);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_0021f1c3;
    if (local_198 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&local_1b8,local_198);
      iVar3 = (*local_198->_vptr_DeathTest[2])();
      pDVar1 = local_198;
      if (iVar3 == 0) {
        testing::KilledBySignal::KilledBySignal
                  ((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),6);
        iVar3 = (*local_198->_vptr_DeathTest[3])();
        bVar2 = testing::KilledBySignal::operator()
                          ((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_0021f171;
        e._0_4_ = 4;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_198);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
                      ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                       ((long)&gtest_msg.value.field_2 + 8));
          }
          (*local_198->_vptr_DeathTest[5])(local_198,2);
          e._0_4_ = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_0021f171:
        e._0_4_ = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr(&local_1b8);
      if ((int)e != 0) {
        if ((int)e != 4) goto LAB_0021f27e;
        goto LAB_0021f1c3;
      }
    }
  }
  else {
LAB_0021f1c3:
    testing::Message::Message(local_1f8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x16b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_200,local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(local_1f8);
  }
  e._0_4_ = 0;
LAB_0021f27e:
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, InvalidUnlockShared1) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  ASSERT_NO_THROW(mtx.unlock_shared());
  EXPECT_CHECK_FAILURE(mtx.unlock_shared());
}